

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

int xmlDOMWrapCloneNode(xmlDOMWrapCtxtPtr_conflict ctxt,xmlDocPtr sourceDoc,xmlNodePtr node,
                       xmlNodePtr *resNode,xmlDocPtr destDoc,xmlNodePtr destParent,int deep,
                       int options)

{
  _xmlDoc *p_Var1;
  _xmlDict *p_Var2;
  xmlNsMapItemPtr pxVar3;
  _xmlNs **pp_Var4;
  xmlElementType xVar5;
  int iVar6;
  _xmlNode *attr;
  xmlChar *pxVar7;
  xmlEntityPtr pxVar8;
  xmlNs *pxVar9;
  xmlNsMapItemPtr_conflict pxVar10;
  xmlNs *pxVar11;
  xmlDocPtr pxVar12;
  xmlChar *pxVar13;
  xmlNsMapItemPtr pxVar14;
  _xmlNode *p_Var15;
  xmlNsPtr pxVar16;
  int iVar17;
  xmlNodePtr pxVar18;
  xmlNodePtr pxVar19;
  _xmlNode *cur;
  int depth;
  _xmlNode *p_Var20;
  xmlNsPtr *retNs;
  xmlNsMapPtr nsMap;
  int in_stack_ffffffffffffff60;
  xmlNodePtr local_90;
  xmlNsMapItemPtr local_78;
  _xmlNs *local_70;
  xmlNs *local_68;
  ulong local_60;
  xmlNodePtr local_58;
  xmlNodePtr local_50;
  xmlNodePtr local_48;
  _xmlDoc *local_40;
  _xmlDict *local_38;
  
  local_78 = (xmlNsMapItemPtr)0x0;
  if ((destDoc != (xmlDocPtr)0x0 && (resNode != (xmlNodePtr *)0x0 && node != (xmlNodePtr)0x0)) &&
     ((destParent == (xmlNodePtr)0x0 || (destParent->doc == destDoc)))) {
    if (node->type != XML_ELEMENT_NODE) {
      return 1;
    }
    p_Var1 = node->doc;
    if ((p_Var1 == sourceDoc || p_Var1 == (_xmlDoc *)0x0) || sourceDoc == (xmlDocPtr)0x0) {
      pxVar12 = sourceDoc;
      if (sourceDoc == (xmlDocPtr)0x0) {
        pxVar12 = p_Var1;
      }
      iVar17 = -1;
      if (sourceDoc == (xmlDocPtr)0x0 && p_Var1 == (_xmlDoc *)0x0) {
        return -1;
      }
      if (ctxt != (xmlDOMWrapCtxtPtr_conflict)0x0) {
        local_78 = (xmlNsMapItemPtr)ctxt->namespaceMap;
      }
      p_Var2 = destDoc->dict;
      *resNode = (xmlNodePtr)0x0;
      if (node->doc == pxVar12) {
        local_60 = 0;
        pxVar19 = (xmlNodePtr)0x0;
        local_90 = (xmlNodePtr)0x0;
        local_50 = (xmlNodePtr)0x0;
        depth = -1;
        cur = node;
        p_Var20 = (_xmlNode *)0x0;
        local_48 = destParent;
        local_40 = pxVar12;
        local_38 = p_Var2;
        while (xVar5 = cur->type, xVar5 < XML_NOTATION_NODE) {
          if ((0x9baU >> (xVar5 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
            if ((xVar5 != XML_ATTRIBUTE_NODE) ||
               (attr = (_xmlNode *)(*xmlMalloc)(0x68), attr == (xmlNodePtr)0x0)) break;
            attr->content = (xmlChar *)0x0;
            attr->properties = (_xmlAttr *)0x0;
            attr->doc = (_xmlDoc *)0x0;
            attr->ns = (xmlNs *)0x0;
            attr->next = (_xmlNode *)0x0;
            attr->prev = (_xmlNode *)0x0;
            attr->last = (_xmlNode *)0x0;
            attr->parent = (_xmlNode *)0x0;
            attr->name = (xmlChar *)0x0;
            attr->children = (_xmlNode *)0x0;
            attr->_private = (void *)0x0;
            *(undefined8 *)&attr->type = 0;
            attr->nsDef = (xmlNs *)0x0;
            pxVar18 = attr;
            if (local_90 != (xmlNodePtr)0x0) {
              attr->parent = pxVar19;
              if (p_Var20 == (_xmlNode *)0x0) {
                pxVar19->properties = (_xmlAttr *)attr;
                pxVar18 = local_90;
              }
              else {
                p_Var20->next = attr;
                attr->prev = p_Var20;
                pxVar18 = local_90;
              }
            }
          }
          else {
            attr = (_xmlNode *)(*xmlMalloc)(0x78);
            if (attr == (xmlNodePtr)0x0) break;
            attr->nsDef = (xmlNs *)0x0;
            attr->psvi = (void *)0x0;
            attr->content = (xmlChar *)0x0;
            attr->properties = (_xmlAttr *)0x0;
            attr->doc = (_xmlDoc *)0x0;
            attr->ns = (xmlNs *)0x0;
            attr->next = (_xmlNode *)0x0;
            attr->prev = (_xmlNode *)0x0;
            attr->last = (_xmlNode *)0x0;
            attr->parent = (_xmlNode *)0x0;
            attr->name = (xmlChar *)0x0;
            attr->children = (_xmlNode *)0x0;
            attr->_private = (void *)0x0;
            *(undefined8 *)&attr->type = 0;
            attr->line = 0;
            attr->extra = 0;
            *(undefined4 *)&attr->field_0x74 = 0;
            pxVar18 = attr;
            if (local_90 != (xmlNodePtr)0x0) {
              attr->parent = pxVar19;
              if (p_Var20 == (_xmlNode *)0x0) {
                pxVar19->children = attr;
              }
              else {
                p_Var20->next = attr;
                attr->prev = p_Var20;
              }
              pxVar19->last = attr;
              pxVar18 = local_90;
            }
          }
          local_90 = pxVar18;
          pxVar13 = "text";
          xVar5 = cur->type;
          attr->type = xVar5;
          attr->doc = destDoc;
          pxVar7 = cur->name;
          if (((pxVar7 == "text") || (pxVar13 = "textnoenc", pxVar7 == "textnoenc")) ||
             (pxVar13 = "comment", pxVar7 == "comment")) {
            attr->name = pxVar13;
          }
          else if (pxVar7 != (xmlChar *)0x0) {
            if (local_38 == (xmlDictPtr)0x0) {
              pxVar7 = xmlStrdup(pxVar7);
            }
            else {
              pxVar7 = xmlDictLookup(local_38,pxVar7,-1);
            }
            attr->name = pxVar7;
            if (pxVar7 == (xmlChar *)0x0) break;
            xVar5 = cur->type;
          }
          switch(xVar5) {
          case XML_ELEMENT_NODE:
            depth = depth + 1;
            if (cur->nsDef == (_xmlNs *)0x0) {
              local_50 = attr;
            }
            else {
              iVar6 = (int)local_60;
              if ((iVar6 == 0 && ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) &&
                  local_48 != (xmlNodePtr)0x0) {
                iVar6 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&local_78,local_48);
                if (iVar6 == -1) goto switchD_0014f4f5_caseD_6;
                local_70 = cur->nsDef;
                local_60 = 1;
                if (cur->nsDef != (_xmlNs *)0x0) goto LAB_0014f659;
              }
              else {
                local_60 = (ulong)(iVar6 + (uint)(iVar6 == 0));
                local_70 = cur->nsDef;
LAB_0014f659:
                pxVar11 = (xmlNs *)&attr->nsDef;
                local_58 = attr;
                do {
                  pxVar9 = (xmlNs *)(*xmlMalloc)(0x30);
                  if (pxVar9 == (xmlNs *)0x0) goto switchD_0014f4f5_caseD_6;
                  pxVar9->next = (_xmlNs *)0x0;
                  *(undefined8 *)&pxVar9->type = 0;
                  pxVar9->_private = (void *)0x0;
                  pxVar9->context = (_xmlDoc *)0x0;
                  pxVar9->href = (xmlChar *)0x0;
                  pxVar9->prefix = (xmlChar *)0x0;
                  pxVar9->type = XML_NAMESPACE_DECL;
                  local_68 = pxVar9;
                  if (local_70->href != (xmlChar *)0x0) {
                    pxVar7 = xmlStrdup(local_70->href);
                    local_68->href = pxVar7;
                    if (pxVar7 != (xmlChar *)0x0) goto LAB_0014f6c0;
                    pxVar7 = local_68->prefix;
joined_r0x0014fb4b:
                    if (pxVar7 != (xmlChar *)0x0) {
                      (*xmlFree)(pxVar7);
                    }
                    goto LAB_0014fbab;
                  }
LAB_0014f6c0:
                  if (local_70->prefix != (xmlChar *)0x0) {
                    pxVar7 = xmlStrdup(local_70->prefix);
                    local_68->prefix = pxVar7;
                    if (pxVar7 == (xmlChar *)0x0) {
                      if (local_68->href != (xmlChar *)0x0) {
                        (*xmlFree)(local_68->href);
                        pxVar7 = local_68->prefix;
                        goto joined_r0x0014fb4b;
                      }
                      goto LAB_0014fbab;
                    }
                  }
                  pxVar11->next = local_68;
                  if ((ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) ||
                     (pxVar11 = local_68, ctxt->getNsForNodeFunc == (xmlDOMWrapAcquireNsFunction)0x0
                     )) {
                    if (local_78 != (xmlNsMapItemPtr)0x0) {
                      for (pxVar10 = local_78->next; pxVar10 != (xmlNsMapItemPtr_conflict)0x0;
                          pxVar10 = pxVar10->next) {
                        if ((-2 < pxVar10->depth) && (pxVar10->shadowDepth == -1)) {
                          pxVar7 = pxVar10->newNs->prefix;
                          if ((local_70->prefix == pxVar7) ||
                             (iVar6 = xmlStrEqual(local_70->prefix,pxVar7), iVar6 != 0)) {
                            pxVar10->shadowDepth = depth;
                          }
                        }
                      }
                    }
                    pxVar11 = local_68;
                    pxVar10 = xmlDOMWrapNsMapAddItem
                                        ((xmlNsMapPtr *)&local_78,-1,local_70,local_68,depth);
                    if (pxVar10 == (xmlNsMapItemPtr_conflict)0x0) {
                      iVar17 = -1;
                      goto switchD_0014f4f5_caseD_6;
                    }
                  }
                  pp_Var4 = &local_70->next;
                  local_70 = *pp_Var4;
                  attr = local_58;
                } while (*pp_Var4 != (_xmlNs *)0x0);
              }
              local_50 = attr;
            }
          case XML_ATTRIBUTE_NODE:
            if (cur->ns != (xmlNs *)0x0) {
              iVar6 = (int)local_60;
              local_60 = (ulong)(iVar6 + (uint)(iVar6 == 0));
              if ((iVar6 == 0 && ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) &&
                  local_48 != (xmlNodePtr)0x0) {
                iVar6 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&local_78,local_48);
                local_60 = 1;
                if (iVar6 == -1) goto switchD_0014f4f5_caseD_6;
              }
              if (local_78 != (xmlNsMapItemPtr)0x0) {
                for (pxVar10 = local_78->next; pxVar10 != (xmlNsMapItemPtr_conflict)0x0;
                    pxVar10 = pxVar10->next) {
                  if ((pxVar10->shadowDepth == -1) && (cur->ns == pxVar10->oldNs)) {
                    retNs = &pxVar10->newNs;
                    goto LAB_0014f904;
                  }
                }
              }
              if (ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) {
                pxVar16 = cur->ns;
LAB_0014f8b5:
                pxVar18 = local_50;
                if (local_48 == (xmlNodePtr)0x0) {
                  pxVar18 = (xmlNodePtr)0x0;
                }
                retNs = &local_70;
                local_58 = attr;
                iVar6 = xmlDOMWrapNSNormAcquireNormalizedNs
                                  (destDoc,pxVar18,pxVar16,retNs,(xmlNsMapPtr *)&local_78,depth,
                                   (uint)(cur->type == XML_ATTRIBUTE_NODE),in_stack_ffffffffffffff60
                                  );
                attr = local_58;
                if (iVar6 == -1) goto switchD_0014f4f5_caseD_6;
              }
              else {
                pxVar16 = cur->ns;
                if (ctxt->getNsForNodeFunc == (xmlDOMWrapAcquireNsFunction)0x0) goto LAB_0014f8b5;
                local_70 = (*ctxt->getNsForNodeFunc)(ctxt,cur,pxVar16->href,pxVar16->prefix);
                pxVar10 = xmlDOMWrapNsMapAddItem((xmlNsMapPtr *)&local_78,-1,cur->ns,local_70,-4);
                retNs = &local_70;
                if (pxVar10 == (xmlNsMapItemPtr_conflict)0x0) {
                  iVar17 = -1;
                  if (local_78 != (xmlNsMapItemPtr)0x0) goto LAB_0014faf1;
                  goto LAB_0014fafc;
                }
              }
LAB_0014f904:
              attr->ns = *retNs;
            }
            if ((attr->type == XML_ATTRIBUTE_NODE) && (attr->parent != (xmlNodePtr)0x0)) {
              iVar6 = xmlIsID(destDoc,attr->parent,(xmlAttrPtr)attr);
              if (iVar6 < 0) goto switchD_0014f4f5_caseD_6;
              if (iVar6 == 1) {
                pxVar11 = (xmlNs *)xmlNodeGetContent(cur);
                if (pxVar11 == (xmlNs *)0x0) goto switchD_0014f4f5_caseD_6;
                local_68 = pxVar11;
                iVar6 = xmlAddIDSafe((xmlAttrPtr)cur,(xmlChar *)pxVar11);
                if (iVar6 < 0) {
LAB_0014fbab:
                  (*xmlFree)(local_68);
                  goto LAB_0014fae2;
                }
                (*xmlFree)(local_68);
              }
            }
            if ((cur->type != XML_ELEMENT_NODE) ||
               (p_Var15 = (_xmlNode *)cur->properties, p_Var15 == (_xmlNode *)0x0)) {
LAB_0014f9b4:
              p_Var15 = cur->children;
              if ((p_Var15 != (_xmlNode *)0x0) && ((deep != 0 || (cur->type == XML_ATTRIBUTE_NODE)))
                 ) goto LAB_0014f9ce;
LAB_0014f9d6:
              if (cur != node) {
                do {
                  xVar5 = cur->type;
                  if ((xVar5 < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
                     ((0x180002U >> (xVar5 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
                    if ((local_78 != (xmlNsMapItemPtr)0x0) &&
                       (pxVar10 = local_78->next, pxVar10 != (xmlNsMapItemPtr_conflict)0x0)) {
                      pxVar16 = (xmlNsPtr)local_78->prev;
                      if (pxVar16 == (xmlNsPtr)0x0) goto LAB_0014fa52;
                      do {
                        if (*(int *)((long)&pxVar16->_private + 4) < depth) break;
                        pxVar3 = *(xmlNsMapItemPtr *)&pxVar16->type;
                        local_78->prev = pxVar3;
                        pxVar14 = local_78;
                        if (pxVar3 != (xmlNsMapItemPtr)0x0) {
                          pxVar14 = pxVar3;
                        }
                        pxVar14->next = (xmlNsMapItemPtr_conflict)0x0;
                        pxVar16->next = local_78->oldNs;
                        local_78->oldNs = pxVar16;
                        pxVar16 = (xmlNsPtr)local_78->prev;
                      } while (pxVar16 != (xmlNsPtr)0x0);
                      for (pxVar10 = local_78->next; pxVar10 != (xmlNsMapItemPtr)0x0;
                          pxVar10 = pxVar10->next) {
LAB_0014fa52:
                        if (depth <= pxVar10->shadowDepth) {
                          pxVar10->shadowDepth = -1;
                        }
                      }
                    }
                    depth = depth + -1;
                  }
                  p_Var15 = cur->next;
                  if (p_Var15 != (_xmlNode *)0x0) goto LAB_0014fa97;
                  attr = attr->parent;
                  if (xVar5 == XML_ATTRIBUTE_NODE) goto LAB_0014faab;
                  if (attr != (_xmlNode *)0x0) {
                    pxVar19 = attr->parent;
                  }
                  cur = cur->parent;
                  if (cur == node) break;
                } while( true );
              }
              iVar17 = 0;
              goto switchD_0014f4f5_caseD_6;
            }
LAB_0014f9ce:
            pxVar19 = attr;
            attr = (_xmlNode *)0x0;
LAB_0014fa97:
            cur = p_Var15;
            p_Var20 = attr;
            if (p_Var15->doc != local_40) goto switchD_0014f4f5_caseD_6;
            break;
          case XML_TEXT_NODE:
          case XML_CDATA_SECTION_NODE:
          case XML_PI_NODE:
          case XML_COMMENT_NODE:
            if (cur->content == (xmlChar *)0x0) goto LAB_0014f9d6;
            pxVar7 = xmlStrdup(cur->content);
            attr->content = pxVar7;
            if (pxVar7 != (xmlChar *)0x0) goto LAB_0014f9d6;
            goto switchD_0014f4f5_caseD_6;
          case XML_ENTITY_REF_NODE:
            if (local_40 == destDoc) {
              attr->content = cur->content;
              attr->children = cur->children;
              pxVar8 = (xmlEntityPtr)cur->last;
            }
            else {
              if ((destDoc->intSubset == (_xmlDtd *)0x0) && (destDoc->extSubset == (_xmlDtd *)0x0))
              goto LAB_0014f9d6;
              pxVar8 = xmlGetDocEntity(destDoc,cur->name);
              if (pxVar8 == (xmlEntityPtr)0x0) goto LAB_0014f9d6;
              attr->content = pxVar8->content;
              attr->children = (_xmlNode *)pxVar8;
            }
            attr->last = (_xmlNode *)pxVar8;
            goto LAB_0014f9d6;
          default:
            goto switchD_0014f4f5_caseD_6;
          case XML_XINCLUDE_START:
          case XML_XINCLUDE_END:
            goto switchD_0014f4f5_caseD_13;
          }
        }
switchD_0014f4f5_caseD_6:
      }
      else {
        local_90 = (xmlNodePtr)0x0;
      }
LAB_0014fae2:
      if (local_78 != (xmlNsMapItemPtr)0x0) {
        if (ctxt != (xmlDOMWrapCtxtPtr_conflict)0x0) {
LAB_0014faf1:
          if ((xmlNsMapItemPtr)ctxt->namespaceMap == local_78) {
            pxVar10 = local_78->next;
            if (pxVar10 != (xmlNsMapItemPtr_conflict)0x0) {
              if ((xmlNsMapItemPtr_conflict)local_78->oldNs != (xmlNsMapItemPtr_conflict)0x0) {
                local_78->prev->next = (xmlNsMapItemPtr_conflict)local_78->oldNs;
                pxVar10 = local_78->next;
              }
              local_78->oldNs = (xmlNsPtr)pxVar10;
              local_78->next = (xmlNsMapItemPtr_conflict)0x0;
            }
            goto LAB_0014fafc;
          }
        }
        xmlDOMWrapNsMapFree((xmlNsMapPtr)local_78);
      }
LAB_0014fafc:
      *resNode = local_90;
      return iVar17;
    }
  }
switchD_0014f4f5_caseD_13:
  return -1;
LAB_0014faab:
  pxVar19 = attr->parent;
  cur = cur->parent;
  goto LAB_0014f9b4;
}

Assistant:

int
xmlDOMWrapCloneNode(xmlDOMWrapCtxtPtr ctxt,
		      xmlDocPtr sourceDoc,
		      xmlNodePtr node,
		      xmlNodePtr *resNode,
		      xmlDocPtr destDoc,
		      xmlNodePtr destParent,
		      int deep,
		      int options ATTRIBUTE_UNUSED)
{
    int ret = 0;
    xmlNodePtr cur, cloneElem = NULL;
    xmlNsMapPtr nsMap = NULL;
    xmlNsMapItemPtr mi;
    xmlNsPtr ns;
    int depth = -1;
    /* int adoptStr = 1; */
    /* gather @parent's ns-decls. */
    int parnsdone = 0;
    /*
    * @ancestorsOnly:
    * TODO: @ancestorsOnly should be set per option.
    *
    */
    int ancestorsOnly = 0;
    xmlNodePtr resultClone = NULL, clone = NULL, parentClone = NULL, prevClone = NULL;
    xmlNsPtr cloneNs = NULL, *cloneNsDefSlot = NULL;
    xmlDictPtr dict; /* The destination dict */

    if ((node == NULL) || (resNode == NULL) || (destDoc == NULL) ||
	((destParent != NULL) && (destParent->doc != destDoc)))
	return(-1);
    /*
    * TODO: Initially we support only element-nodes.
    */
    if (node->type != XML_ELEMENT_NODE)
	return(1);
    /*
    * Check node->doc sanity.
    */
    if ((node->doc != NULL) && (sourceDoc != NULL) &&
	(node->doc != sourceDoc)) {
	/*
	* Might be an XIncluded node.
	*/
	return (-1);
    }
    if (sourceDoc == NULL)
	sourceDoc = node->doc;
    if (sourceDoc == NULL)
        return (-1);

    dict = destDoc->dict;
    /*
    * Reuse the namespace map of the context.
    */
    if (ctxt)
	nsMap = (xmlNsMapPtr) ctxt->namespaceMap;

    *resNode = NULL;

    cur = node;
    while (cur != NULL) {
	if (cur->doc != sourceDoc) {
	    /*
	    * We'll assume XIncluded nodes if the doc differs.
	    * TODO: Do we need to reconciliate XIncluded nodes?
	    * TODO: This here returns -1 in this case.
	    */
	    goto internal_error;
	}
	/*
	* Create a new node.
	*/
	switch (cur->type) {
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		/*
		* TODO: What to do with XInclude?
		*/
		goto internal_error;
		break;
	    case XML_ELEMENT_NODE:
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
	    case XML_COMMENT_NODE:
	    case XML_PI_NODE:
	    case XML_DOCUMENT_FRAG_NODE:
	    case XML_ENTITY_REF_NODE:
		/*
		* Nodes of xmlNode structure.
		*/
		clone = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
		if (clone == NULL)
		    goto internal_error;
		memset(clone, 0, sizeof(xmlNode));
		/*
		* Set hierarchical links.
		*/
		if (resultClone != NULL) {
		    clone->parent = parentClone;
		    if (prevClone) {
			prevClone->next = clone;
			clone->prev = prevClone;
		    } else
			parentClone->children = clone;
                    parentClone->last = clone;
		} else
		    resultClone = clone;

		break;
	    case XML_ATTRIBUTE_NODE:
		/*
		* Attributes (xmlAttr).
		*/
		clone = xmlMalloc(sizeof(xmlAttr));
		if (clone == NULL)
		    goto internal_error;
		memset(clone, 0, sizeof(xmlAttr));
		/*
		* Set hierarchical links.
		* TODO: Change this to add to the end of attributes.
		*/
		if (resultClone != NULL) {
		    clone->parent = parentClone;
		    if (prevClone) {
			prevClone->next = clone;
			clone->prev = prevClone;
		    } else
			parentClone->properties = (xmlAttrPtr) clone;
		} else
		    resultClone = clone;
		break;
	    default:
		/*
		* TODO QUESTION: Any other nodes expected?
		*/
		goto internal_error;
	}

	clone->type = cur->type;
	clone->doc = destDoc;

	/*
	* Clone the name of the node if any.
	*/
	if (cur->name == xmlStringText)
	    clone->name = xmlStringText;
	else if (cur->name == xmlStringTextNoenc)
	    /*
	    * NOTE: Although xmlStringTextNoenc is never assigned to a node
	    *   in tree.c, it might be set in Libxslt via
	    *   "xsl:disable-output-escaping".
	    */
	    clone->name = xmlStringTextNoenc;
	else if (cur->name == xmlStringComment)
	    clone->name = xmlStringComment;
	else if (cur->name != NULL) {
            if (dict != NULL)
                clone->name = xmlDictLookup(dict, cur->name, -1);
            else
                clone->name = xmlStrdup(cur->name);
            if (clone->name == NULL)
                goto internal_error;
	}

	switch (cur->type) {
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		/*
		* TODO
		*/
		return (-1);
	    case XML_ELEMENT_NODE:
		cloneElem = clone;
		depth++;
		/*
		* Namespace declarations.
		*/
		if (cur->nsDef != NULL) {
		    if (! parnsdone) {
			if (destParent && (ctxt == NULL)) {
			    /*
			    * Gather @parent's in-scope ns-decls.
			    */
			    if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
				destParent) == -1)
				goto internal_error;
			}
			parnsdone = 1;
		    }
		    /*
		    * Clone namespace declarations.
		    */
		    cloneNsDefSlot = &(clone->nsDef);
		    for (ns = cur->nsDef; ns != NULL; ns = ns->next) {
			/*
			* Create a new xmlNs.
			*/
			cloneNs = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
			if (cloneNs == NULL)
			    goto internal_error;
			memset(cloneNs, 0, sizeof(xmlNs));
			cloneNs->type = XML_LOCAL_NAMESPACE;

			if (ns->href != NULL) {
			    cloneNs->href = xmlStrdup(ns->href);
                            if (cloneNs->href == NULL) {
                                xmlFreeNs(cloneNs);
                                goto internal_error;
                            }
                        }
			if (ns->prefix != NULL) {
			    cloneNs->prefix = xmlStrdup(ns->prefix);
                            if (cloneNs->prefix == NULL) {
                                xmlFreeNs(cloneNs);
                                goto internal_error;
                            }
                        }

			*cloneNsDefSlot = cloneNs;
			cloneNsDefSlot = &(cloneNs->next);

			/*
			* Note that for custom handling of ns-references,
			* the ns-decls need not be stored in the ns-map,
			* since they won't be referenced by node->ns.
			*/
			if ((ctxt == NULL) ||
			    (ctxt->getNsForNodeFunc == NULL))
			{
			    /*
			    * Does it shadow any ns-decl?
			    */
			    if (XML_NSMAP_NOTEMPTY(nsMap)) {
				XML_NSMAP_FOREACH(nsMap, mi) {
				    if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
					(mi->shadowDepth == -1) &&
					((ns->prefix == mi->newNs->prefix) ||
					xmlStrEqual(ns->prefix,
					mi->newNs->prefix))) {
					/*
					* Mark as shadowed at the current
					* depth.
					*/
					mi->shadowDepth = depth;
				    }
				}
			    }
			    /*
			    * Push mapping.
			    */
			    if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
				ns, cloneNs, depth) == NULL)
				goto internal_error;
			}
		    }
		}
		/* cur->ns will be processed further down. */
		break;
	    case XML_ATTRIBUTE_NODE:
		/* IDs will be processed further down. */
		/* cur->ns will be processed further down. */
		break;
	    case XML_PI_NODE:
	    case XML_COMMENT_NODE:
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
		/*
		* Note that this will also cover the values of attributes.
		*/
                if (cur->content != NULL) {
                    clone->content = xmlStrdup(cur->content);
                    if (clone->content == NULL)
                        goto internal_error;
                }
		goto leave_node;
	    case XML_ENTITY_REF_NODE:
		if (sourceDoc != destDoc) {
		    if ((destDoc->intSubset) || (destDoc->extSubset)) {
			xmlEntityPtr ent;
			/*
			* Different doc: Assign new entity-node if available.
			*/
			ent = xmlGetDocEntity(destDoc, cur->name);
			if (ent != NULL) {
			    clone->content = ent->content;
			    clone->children = (xmlNodePtr) ent;
			    clone->last = (xmlNodePtr) ent;
			}
		    }
		} else {
		    /*
		    * Same doc: Use the current node's entity declaration
		    * and value.
		    */
		    clone->content = cur->content;
		    clone->children = cur->children;
		    clone->last = cur->last;
		}
		goto leave_node;
	    default:
		goto internal_error;
	}

	if (cur->ns == NULL)
	    goto end_ns_reference;

/* handle_ns_reference: */
	/*
	** The following will take care of references to ns-decls ********
	** and is intended only for element- and attribute-nodes.
	**
	*/
	if (! parnsdone) {
	    if (destParent && (ctxt == NULL)) {
		if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap, destParent) == -1)
		    goto internal_error;
	    }
	    parnsdone = 1;
	}
	/*
	* Adopt ns-references.
	*/
	if (XML_NSMAP_NOTEMPTY(nsMap)) {
	    /*
	    * Search for a mapping.
	    */
	    XML_NSMAP_FOREACH(nsMap, mi) {
		if ((mi->shadowDepth == -1) &&
		    (cur->ns == mi->oldNs)) {
		    /*
		    * This is the nice case: a mapping was found.
		    */
		    clone->ns = mi->newNs;
		    goto end_ns_reference;
		}
	    }
	}
	/*
	* No matching namespace in scope. We need a new one.
	*/
	if ((ctxt != NULL) && (ctxt->getNsForNodeFunc != NULL)) {
	    /*
	    * User-defined behaviour.
	    */
	    ns = ctxt->getNsForNodeFunc(ctxt, cur,
		cur->ns->href, cur->ns->prefix);
	    /*
	    * Add user's mapping.
	    */
	    if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
		cur->ns, ns, XML_TREE_NSMAP_CUSTOM) == NULL)
		goto internal_error;
	    clone->ns = ns;
	} else {
	    /*
	    * Acquire a normalized ns-decl and add it to the map.
	    */
	    if (xmlDOMWrapNSNormAcquireNormalizedNs(destDoc,
		/* ns-decls on cloneElem or on destDoc->oldNs */
		destParent ? cloneElem : NULL,
		cur->ns, &ns,
		&nsMap, depth,
		/* if we need to search only in the ancestor-axis */
		ancestorsOnly,
		/* ns-decls must be prefixed for attributes. */
		(cur->type == XML_ATTRIBUTE_NODE) ? 1 : 0) == -1)
		goto internal_error;
	    clone->ns = ns;
	}

end_ns_reference:

	/*
	* Some post-processing.
	*
	* Handle ID attributes.
	*/
	if ((clone->type == XML_ATTRIBUTE_NODE) &&
	    (clone->parent != NULL))
	{
            int res;

	    res = xmlIsID(destDoc, clone->parent, (xmlAttrPtr) clone);
            if (res < 0)
                goto internal_error;
            if (res == 1) {
		xmlChar *idVal;

		idVal = xmlNodeGetContent(cur);
                if (idVal == NULL)
                    goto internal_error;
                if (xmlAddIDSafe((xmlAttrPtr) cur, idVal) < 0) {
                    xmlFree(idVal);
                    goto internal_error;
                }
                xmlFree(idVal);
	    }
	}
	/*
	**
	** The following will traverse the tree **************************
	**
	*
	* Walk the element's attributes before descending into child-nodes.
	*/
	if ((cur->type == XML_ELEMENT_NODE) && (cur->properties != NULL)) {
	    prevClone = NULL;
	    parentClone = clone;
	    cur = (xmlNodePtr) cur->properties;
	    continue;
	}
into_content:
	/*
	* Descend into child-nodes.
	*/
	if (cur->children != NULL) {
	    if (deep || (cur->type == XML_ATTRIBUTE_NODE)) {
		prevClone = NULL;
		parentClone = clone;
		cur = cur->children;
		continue;
	    }
	}

leave_node:
	/*
	* At this point we are done with the node, its content
	* and an element-nodes's attribute-nodes.
	*/
	if (cur == node)
	    break;
	if ((cur->type == XML_ELEMENT_NODE) ||
	    (cur->type == XML_XINCLUDE_START) ||
	    (cur->type == XML_XINCLUDE_END)) {
	    /*
	    * TODO: Do we expect nsDefs on XML_XINCLUDE_START?
	    */
	    if (XML_NSMAP_NOTEMPTY(nsMap)) {
		/*
		* Pop mappings.
		*/
		while ((nsMap->last != NULL) &&
		    (nsMap->last->depth >= depth))
		{
		    XML_NSMAP_POP(nsMap, mi)
		}
		/*
		* Unshadow.
		*/
		XML_NSMAP_FOREACH(nsMap, mi) {
		    if (mi->shadowDepth >= depth)
			mi->shadowDepth = -1;
		}
	    }
	    depth--;
	}
	if (cur->next != NULL) {
	    prevClone = clone;
	    cur = cur->next;
	} else if (cur->type != XML_ATTRIBUTE_NODE) {
	    clone = clone->parent;
	    if (clone != NULL)
		parentClone = clone->parent;
	    /*
	    * Process parent --> next;
	    */
	    cur = cur->parent;
	    goto leave_node;
	} else {
	    /* This is for attributes only. */
	    clone = clone->parent;
	    parentClone = clone->parent;
	    /*
	    * Process parent-element --> children.
	    */
	    cur = cur->parent;
	    goto into_content;
	}
    }
    goto exit;

internal_error:
    ret = -1;

exit:
    /*
    * Cleanup.
    */
    if (nsMap != NULL) {
	if ((ctxt) && (ctxt->namespaceMap == nsMap)) {
	    /*
	    * Just cleanup the map but don't free.
	    */
	    if (nsMap->first) {
		if (nsMap->pool)
		    nsMap->last->next = nsMap->pool;
		nsMap->pool = nsMap->first;
		nsMap->first = NULL;
	    }
	} else
	    xmlDOMWrapNsMapFree(nsMap);
    }
    /*
    * TODO: Should we try a cleanup of the cloned node in case of a
    * fatal error?
    */
    *resNode = resultClone;
    return (ret);
}